

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ootake_PSG.c
# Opt level: O0

void * OPSG_Init(UINT32 clock,UINT32 sampleRate)

{
  huc6280_state *info;
  UINT32 sampleRate_local;
  UINT32 clock_local;
  
  if (_bTblInit == '\0') {
    create_volume_table();
    create_noise_table();
    _bTblInit = '\x01';
  }
  _sampleRate_local = (huc6280_state *)calloc(1,0x678);
  if (_sampleRate_local == (huc6280_state *)0x0) {
    _sampleRate_local = (huc6280_state *)0x0;
  }
  else {
    _sampleRate_local->PSG_FRQ = (double)clock;
    _sampleRate_local->PsgVolumeEffect = 0;
    _sampleRate_local->Volume = 0.0;
    _sampleRate_local->VOL = 0.0;
    _sampleRate_local->Volume = 0.00820415885220536;
    set_VOL(_sampleRate_local);
    psg_reset(_sampleRate_local);
    OPSG_SetMuteMask(_sampleRate_local,0);
    _sampleRate_local->SAMPLE_RATE = (double)sampleRate;
    _sampleRate_local->RESMPL_RATE =
         (_sampleRate_local->PSG_FRQ / 1.0) / _sampleRate_local->SAMPLE_RATE;
  }
  return _sampleRate_local;
}

Assistant:

static void*
OPSG_Init(
	UINT32		clock,
	UINT32		sampleRate)
{
	huc6280_state* info;
	
	if (! _bTblInit)
	{
		create_volume_table();
		create_noise_table();
		_bTblInit = TRUE;
	}

	info = (huc6280_state*)calloc(1, sizeof(huc6280_state));
	if (info == NULL)
		return NULL;
	
	info->PSG_FRQ = clock;
	
	info->PsgVolumeEffect = 0;
	info->Volume = 0;
	info->VOL = 0.0;
	
	info->Volume = 1.0 / PSG_DECLINE;
	set_VOL(info);

	psg_reset(info);

	OPSG_SetMuteMask(info, 0x00);

	info->SAMPLE_RATE = sampleRate;
	info->RESMPL_RATE = info->PSG_FRQ / OVERSAMPLE_RATE / info->SAMPLE_RATE;

	return info;
}